

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerMeshless::AccumulateStep2(ChProximityContainerMeshless *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  _List_node_base *p_Var18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  for (p_Var18 = (this->proximitylist).
                 super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var18 != (_List_node_base *)&this->proximitylist; p_Var18 = p_Var18->_M_next) {
    lVar23 = (**(code **)((long)(p_Var18[1]._M_next)->_M_next + 0x18))();
    if (*(long *)(lVar23 + 0x10) == 0) {
      lVar23 = 0;
    }
    else {
      lVar23 = __dynamic_cast(*(long *)(lVar23 + 0x10),&ChContactable::typeinfo,
                              &fea::ChNodeMeshless::typeinfo,0x50);
    }
    lVar24 = (**(code **)((long)(p_Var18[1]._M_next)->_M_next + 0x20))();
    if (*(long *)(lVar24 + 0x10) == 0) {
      lVar24 = 0;
    }
    else {
      lVar24 = __dynamic_cast(*(long *)(lVar24 + 0x10),&ChContactable::typeinfo,
                              &fea::ChNodeMeshless::typeinfo,0x50);
    }
    dVar28 = *(double *)(lVar23 + 8);
    dVar1 = *(double *)(lVar23 + 0x10);
    dVar29 = *(double *)(lVar23 + 0x18);
    dVar2 = *(double *)(lVar24 + 8);
    dVar3 = *(double *)(lVar24 + 0x10);
    dVar4 = *(double *)(lVar24 + 0x18);
    dVar19 = *(double *)(lVar24 + 0x78) - *(double *)(lVar23 + 0x78);
    dVar20 = *(double *)(lVar24 + 0x80) - *(double *)(lVar23 + 0x80);
    dVar21 = *(double *)(lVar24 + 0x88) - *(double *)(lVar23 + 0x88);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar20 * dVar20;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar19;
    auVar30 = vfmadd231sd_fma(auVar30,auVar45,auVar45);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar21;
    auVar30 = vfmadd231sd_fma(auVar30,auVar35,auVar35);
    if (auVar30._0_8_ < 0.0) {
      dVar27 = sqrt(auVar30._0_8_);
    }
    else {
      auVar30 = vsqrtsd_avx(auVar30,auVar30);
      dVar27 = auVar30._0_8_;
    }
    dVar5 = *(double *)(lVar23 + 0x2a8);
    dVar44 = 0.0;
    if (dVar27 < dVar5) {
      dVar26 = pow(dVar5,9.0);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar5;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar27 * dVar27;
      auVar30 = vfmsub231sd_fma(auVar25,auVar37,auVar37);
      dVar44 = pow(auVar30._0_8_,3.0);
      dVar44 = dVar44 * (315.0 / (dVar26 * 201.06192982974676));
    }
    auVar36 = ZEXT816(0) << 0x40;
    dVar5 = *(double *)(lVar24 + 0x2a8);
    if (dVar27 < dVar5) {
      dVar26 = pow(dVar5,9.0);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar5;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar27 * dVar27;
      auVar30 = vfmsub231sd_fma(auVar31,auVar38,auVar38);
      dVar27 = pow(auVar30._0_8_,3.0);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar27 * (315.0 / (dVar26 * 201.06192982974676));
    }
    auVar22._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = 0x8000000000000000;
    auVar25 = vxorpd_avx512vl(auVar36,auVar22);
    dVar27 = dVar20 * dVar44;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(lVar23 + 0x120);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar19 * dVar44;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar27 * *(double *)(lVar23 + 0x128);
    auVar30 = vfmadd231sd_fma(auVar48,auVar39,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(lVar23 + 0x130);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar21 * dVar44;
    auVar30 = vfmadd231sd_fma(auVar30,auVar46,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(lVar23 + 0x138);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar27 * *(double *)(lVar23 + 0x140);
    auVar35 = vfmadd231sd_fma(auVar51,auVar39,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(lVar23 + 0x148);
    auVar35 = vfmadd231sd_fma(auVar35,auVar46,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(lVar23 + 0x150);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar19 * dVar44;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar27 * *(double *)(lVar23 + 0x158);
    auVar45 = vfmadd231sd_fma(auVar42,auVar40,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(lVar23 + 0x160);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar21 * dVar44;
    auVar45 = vfmadd231sd_fma(auVar45,auVar47,auVar11);
    *(double *)(lVar23 + 0x280) = auVar30._0_8_ + *(double *)(lVar23 + 0x280);
    *(double *)(lVar23 + 0x288) = auVar35._0_8_ + *(double *)(lVar23 + 0x288);
    *(double *)(lVar23 + 0x290) = auVar45._0_8_ + *(double *)(lVar23 + 0x290);
    dVar27 = auVar25._0_8_;
    dVar20 = dVar20 * dVar27;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(lVar24 + 0x120);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar19 * dVar27;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar20 * *(double *)(lVar24 + 0x128);
    auVar25 = vfmadd231sd_fma(auVar53,auVar49,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(lVar24 + 0x130);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar21 * dVar27;
    auVar25 = vfmadd231sd_fma(auVar25,auVar32,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(lVar24 + 0x138);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar20 * *(double *)(lVar24 + 0x140);
    auVar37 = vfmadd231sd_fma(auVar54,auVar49,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(lVar24 + 0x148);
    auVar37 = vfmadd231sd_fma(auVar37,auVar32,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(lVar24 + 0x150);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar19 * dVar27;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar20 * *(double *)(lVar24 + 0x158);
    auVar36 = vfmadd231sd_fma(auVar52,auVar50,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(lVar24 + 0x160);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar21 * dVar27;
    auVar36 = vfmadd231sd_fma(auVar36,auVar33,auVar17);
    *(double *)(lVar24 + 0x280) = (*(double *)(lVar24 + 0x280) - auVar30._0_8_) + auVar25._0_8_;
    *(double *)(lVar24 + 0x288) = (*(double *)(lVar24 + 0x288) - auVar35._0_8_) + auVar37._0_8_;
    *(double *)(lVar24 + 0x290) = (*(double *)(lVar24 + 0x290) - auVar45._0_8_) + auVar36._0_8_;
    *(double *)(lVar23 + 0x280) = *(double *)(lVar23 + 0x280) - auVar25._0_8_;
    *(double *)(lVar23 + 0x288) = *(double *)(lVar23 + 0x288) - auVar37._0_8_;
    *(double *)(lVar23 + 0x290) = *(double *)(lVar23 + 0x290) - auVar36._0_8_;
    dVar3 = dVar3 - dVar1;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar3 * dVar3;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar2 - dVar28;
    auVar30 = vfmadd231sd_fma(auVar34,auVar41,auVar41);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar4 - dVar29;
    auVar30 = vfmadd231sd_fma(auVar30,auVar43,auVar43);
    if (auVar30._0_8_ < 0.0) {
      dVar28 = sqrt(auVar30._0_8_);
    }
    else {
      auVar30 = vsqrtsd_avx(auVar30,auVar30);
      dVar28 = auVar30._0_8_;
    }
    dVar1 = *(double *)(lVar23 + 0x2a8);
    dVar29 = 0.0;
    if (dVar28 < dVar1) {
      dVar29 = pow(dVar1,6.0);
      dVar29 = (dVar1 - dVar28) * (45.0 / (dVar29 * 3.141592653589793));
    }
    dVar29 = dVar29 * (*(double *)(*(long *)(lVar23 + 0x70) + 0xa0) +
                      *(double *)(*(long *)(lVar24 + 0x70) + 0xa0)) * 0.5 *
                      *(double *)(lVar23 + 0x298) * *(double *)(lVar24 + 0x298);
    dVar28 = (*(double *)(lVar24 + 0x20) - *(double *)(lVar23 + 0x20)) * dVar29;
    dVar1 = (*(double *)(lVar24 + 0x28) - *(double *)(lVar23 + 0x28)) * dVar29;
    dVar29 = (*(double *)(lVar24 + 0x30) - *(double *)(lVar23 + 0x30)) * dVar29;
    *(double *)(lVar23 + 0x280) = dVar28 + *(double *)(lVar23 + 0x280);
    *(double *)(lVar23 + 0x288) = dVar1 + *(double *)(lVar23 + 0x288);
    *(double *)(lVar23 + 0x290) = dVar29 + *(double *)(lVar23 + 0x290);
    *(double *)(lVar24 + 0x280) = *(double *)(lVar24 + 0x280) - dVar28;
    *(double *)(lVar24 + 0x288) = *(double *)(lVar24 + 0x288) - dVar1;
    *(double *)(lVar24 + 0x290) = *(double *)(lVar24 + 0x290) - dVar29;
  }
  return;
}

Assistant:

void ChProximityContainerMeshless::AccumulateStep2() {
    // Per-edge data computation (transfer stress to forces)
    std::list<ChProximityMeshless*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        ChNodeMeshless* mnodeA = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelA()->GetContactable());
        ChNodeMeshless* mnodeB = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelB()->GetContactable());

        ChVector<> x_A = mnodeA->GetPos();
        ChVector<> x_B = mnodeB->GetPos();
        ChVector<> x_Aref = mnodeA->GetPosReference();
        ChVector<> x_Bref = mnodeB->GetPosReference();

        ChVector<> d_BA = x_Bref - x_Aref;

        double dist_BA = d_BA.Length();
        double W_BA = W_sph(dist_BA, mnodeA->GetKernelRadius());
        double W_AB = W_sph(dist_BA, mnodeB->GetKernelRadius());

        // increment elastoplastic forces of connected nodes

        mnodeA->UserForce += mnodeA->FA * (d_BA * W_BA);
        mnodeB->UserForce -= mnodeA->FA * (d_BA * W_BA);

        mnodeB->UserForce += mnodeB->FA * (d_BA * (-W_AB));
        mnodeA->UserForce -= mnodeB->FA * (d_BA * (-W_AB));

        // increment viscous forces..

        ChVector<> r_BA = x_B - x_A;
        double r_length = r_BA.Length();
        double W_BA_visc = W_sq_visco(r_length, mnodeA->GetKernelRadius());
        ChVector<> velBA = mnodeB->GetPos_dt() - mnodeA->GetPos_dt();

        double avg_viscosity =
            0.5 * (mnodeA->GetMatterContainer()->GetViscosity() + mnodeB->GetMatterContainer()->GetViscosity());

        ChVector<> viscforceBA = velBA * (mnodeA->volume * avg_viscosity * mnodeB->volume * W_BA_visc);
        mnodeA->UserForce += viscforceBA;
        mnodeB->UserForce -= viscforceBA;

        ++iterproximity;
    }
}